

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O0

int nni_listener_create_url(nni_listener **lp,nni_sock *s,nng_url *url)

{
  char *url_00;
  nni_sp_tran *tran_00;
  size_t sz_00;
  nni_listener *l_00;
  size_t sz;
  int rv;
  nni_listener *l;
  nni_sp_tran *tran;
  nng_url *url_local;
  nni_sock *s_local;
  nni_listener **lp_local;
  
  url_00 = nng_url_scheme(url);
  tran_00 = nni_sp_tran_find(url_00);
  if ((tran_00 == (nni_sp_tran *)0x0) || (tran_00->tran_listener == (nni_sp_listener_ops *)0x0)) {
    lp_local._4_4_ = 9;
  }
  else {
    sz_00 = tran_00->tran_listener->l_size + 0x858;
    l_00 = (nni_listener *)nni_zalloc(sz_00);
    if (l_00 == (nni_listener *)0x0) {
      lp_local._4_4_ = 2;
    }
    else {
      lp_local._4_4_ = nni_url_clone_inline(&l_00->l_url,url);
      if (lp_local._4_4_ == 0) {
        lp_local._4_4_ = nni_listener_init(l_00,s,tran_00);
        if (lp_local._4_4_ == 0) {
          *lp = l_00;
          lp_local._4_4_ = 0;
        }
        else {
          nni_listener_destroy(l_00);
        }
      }
      else {
        nni_free(l_00,sz_00);
      }
    }
  }
  return lp_local._4_4_;
}

Assistant:

int
nni_listener_create_url(nni_listener **lp, nni_sock *s, const nng_url *url)
{
	nni_sp_tran  *tran;
	nni_listener *l;
	int           rv;
	size_t        sz;

	if (((tran = nni_sp_tran_find(nng_url_scheme(url))) == NULL) ||
	    (tran->tran_listener == NULL)) {
		return (NNG_ENOTSUP);
	}
	sz = NNI_ALIGN_UP(sizeof(*l)) + tran->tran_listener->l_size;
	if ((l = nni_zalloc(sz)) == NULL) {
		return (NNG_ENOMEM);
	}
	if ((rv = nni_url_clone_inline(&l->l_url, url)) != 0) {
		nni_free(l, sz);
		return (rv);
	}
	if ((rv = nni_listener_init(l, s, tran)) != 0) {
		nni_listener_destroy(l);
		return (rv);
	}

	*lp = l;
	return (0);
}